

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O2

ostream * operator<<(ostream *out,DataSet *dataset)

{
  Matrix<double> *this;
  ostream *poVar1;
  undefined8 uVar2;
  uint j;
  uint col;
  uint i;
  uint row;
  double dVar3;
  Shape local_40;
  
  this = &dataset->m_matrix;
  local_40.n_row = (dataset->m_matrix).m_shape.n_row;
  local_40.n_col = (dataset->m_matrix).m_shape.n_col;
  local_40.is_diogonal = (dataset->m_matrix).m_shape.is_diogonal;
  poVar1 = operator<<(out,&local_40);
  std::operator<<(poVar1,'\n');
  for (row = 0; uVar2._0_4_ = (this->m_shape).n_row, uVar2._4_4_ = (this->m_shape).n_col,
      row < (uint)(undefined4)uVar2; row = row + 1) {
    for (col = 0; col < (uint)((ulong)uVar2 >> 0x20); col = col + 1) {
      dVar3 = Matrix<double>::get(this,row,col);
      poVar1 = std::ostream::_M_insert<double>(dVar3);
      std::operator<<(poVar1,'\t');
      uVar2._0_4_ = (this->m_shape).n_row;
      uVar2._4_4_ = (this->m_shape).n_col;
    }
    std::operator<<(out,'\n');
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const DataSet& dataset){
    out<<dataset.shape()<<'\n';
    for(unsigned i=0;i<dataset.m_matrix.shape().n_row;++i){
        for(unsigned j=0;j<dataset.m_matrix.shape().n_col;++j){
            out<<dataset.m_matrix.get(i,j)<<'\t';
        }   out<<'\n';
    }
    return out;
}